

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_end_utt(acmod_t *acmod)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint local_1c;
  int32 rv;
  int32 outlen;
  int inptr;
  int32 nfr;
  acmod_t *acmod_local;
  
  outlen = 0;
  acmod->state = '\x03';
  _inptr = acmod;
  if (acmod->n_mfc_frame < acmod->n_mfc_alloc) {
    rv = (acmod->mfc_outidx + acmod->n_mfc_frame) % acmod->n_mfc_alloc;
    fe_end_utt(acmod->fe,acmod->mfc_buf[rv],&outlen);
    _inptr->n_mfc_frame = outlen + _inptr->n_mfc_frame;
    if (outlen == 0) {
      feat_update_stats(_inptr->fcb);
    }
    else {
      outlen = acmod_process_mfcbuf(_inptr);
    }
  }
  else {
    feat_update_stats(acmod->fcb);
  }
  if (_inptr->mfcfh != (FILE *)0x0) {
    lVar3 = ftell((FILE *)_inptr->mfcfh);
    uVar1 = (uint)((lVar3 + -4) / 4);
    local_1c = (int)uVar1 >> 0x18 & 0xffU | (int)uVar1 >> 8 & 0xff00U | (uVar1 & 0xff00) << 8 |
               uVar1 << 0x18;
    iVar2 = fseek((FILE *)_inptr->mfcfh,0,0);
    if (iVar2 == 0) {
      fwrite(&local_1c,4,1,(FILE *)_inptr->mfcfh);
    }
    fclose((FILE *)_inptr->mfcfh);
    _inptr->mfcfh = (FILE *)0x0;
  }
  if (_inptr->rawfh != (FILE *)0x0) {
    fclose((FILE *)_inptr->rawfh);
    _inptr->rawfh = (FILE *)0x0;
  }
  if (_inptr->senfh != (FILE *)0x0) {
    fclose((FILE *)_inptr->senfh);
    _inptr->senfh = (FILE *)0x0;
  }
  return outlen;
}

Assistant:

int
acmod_end_utt(acmod_t *acmod)
{
    int32 nfr = 0;

    acmod->state = ACMOD_ENDED;
    if (acmod->n_mfc_frame < acmod->n_mfc_alloc) {
        int inptr;
        /* Where to start writing them (circular buffer) */
        inptr = (acmod->mfc_outidx + acmod->n_mfc_frame) % acmod->n_mfc_alloc;
        /* nfr is always either zero or one. */
        fe_end_utt(acmod->fe, acmod->mfc_buf[inptr], &nfr);
        acmod->n_mfc_frame += nfr;
        /* Process whatever's left, and any leadout. */
        if (nfr)
            nfr = acmod_process_mfcbuf(acmod);
        else /* Make sure to update CMN! */
            feat_update_stats(acmod->fcb);
    }
    else /* Make sure to update CMN! */
        feat_update_stats(acmod->fcb);
    if (acmod->mfcfh) {
        int32 outlen, rv;
        outlen = (ftell(acmod->mfcfh) - 4) / 4;
        SWAP_BE_32(&outlen);
        /* Try to seek and write */
        if ((rv = fseek(acmod->mfcfh, 0, SEEK_SET)) == 0) {
            fwrite(&outlen, 4, 1, acmod->mfcfh);
        }
        fclose(acmod->mfcfh);
        acmod->mfcfh = NULL;
    }
    if (acmod->rawfh) {
        fclose(acmod->rawfh);
        acmod->rawfh = NULL;
    }

    if (acmod->senfh) {
        fclose(acmod->senfh);
        acmod->senfh = NULL;
    }

    return nfr;
}